

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS
ref_fixture_tet_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  REF_DBL RVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  REF_GRID_conflict pRVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  REF_INT cell;
  REF_INT tri [4];
  REF_INT tet [4];
  REF_INT node;
  REF_INT local_ec;
  int local_e8;
  uint local_e4;
  uint local_e0;
  undefined4 local_dc;
  double local_d8;
  double local_d0;
  REF_GRID_conflict local_c8;
  REF_DBL local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong local_a8;
  int local_a0;
  int local_9c;
  REF_DBL local_98;
  ulong local_90;
  double local_88;
  int local_7c;
  ulong local_78;
  uint local_6c;
  double local_68;
  double local_60;
  double local_58;
  ulong local_50;
  long local_48;
  uint local_40;
  int local_3c;
  REF_NODE local_38;
  
  uVar9 = (ulong)(uint)m;
  uVar13 = (ulong)(uint)l;
  local_d8 = x1;
  local_d0 = x0;
  local_88 = z1;
  local_68 = z0;
  local_60 = y1;
  local_58 = y0;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  uVar15 = (ulong)uVar2;
  if (uVar2 == 0) {
    pRVar16 = *ref_grid_ptr;
    ref_node = pRVar16->node;
    if (pRVar16->mpi->id == 0) {
      local_7c = l + -1;
      local_a0 = m + -1;
      local_6c = n - 1;
      local_c8 = pRVar16;
      local_a8 = uVar13;
      local_90 = uVar9;
      local_78 = (ulong)(uint)n;
      if (0 < n) {
        local_d8 = (local_d8 - local_d0) / (double)local_7c;
        dVar21 = (local_60 - local_58) / (double)local_a0;
        dVar19 = (local_88 - local_68) / (double)(int)local_6c;
        local_50 = (ulong)(uint)(m * l);
        lVar7 = 0;
        local_9c = 0;
        dVar20 = local_68;
        dVar22 = local_58;
        local_88 = dVar19;
        local_60 = dVar21;
        do {
          local_48 = lVar7;
          if (0 < (int)uVar9) {
            local_98 = (double)local_9c * dVar19 + dVar20;
            iVar17 = 0;
            do {
              if (0 < (int)uVar13) {
                local_c0 = (double)iVar17 * dVar21 + dVar22;
                uVar13 = 0;
                do {
                  uVar2 = ref_node_add(ref_node,(long)((int)lVar7 + (int)uVar13),&local_3c);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x66b,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"node");
                    return uVar2;
                  }
                  pRVar1 = ref_node->real;
                  lVar5 = (long)local_3c;
                  pRVar1[lVar5 * 0xf] = (double)(int)uVar13 * local_d8 + local_d0;
                  pRVar1[lVar5 * 0xf + 1] = local_c0;
                  pRVar1[lVar5 * 0xf + 2] = local_98;
                  uVar13 = uVar13 + 1;
                } while ((uint)l != uVar13);
              }
              iVar17 = iVar17 + 1;
              lVar7 = lVar7 + (ulong)(uint)l;
              uVar9 = local_90;
              uVar13 = local_a8;
              dVar19 = local_88;
              dVar20 = local_68;
              dVar21 = local_60;
              dVar22 = local_58;
            } while (iVar17 != (int)local_90);
          }
          local_9c = local_9c + 1;
          lVar7 = local_48 + local_50;
        } while (local_9c != (int)local_78);
      }
      iVar17 = (int)local_78;
      local_38 = ref_node;
      if (1 < iVar17) {
        uVar2 = ((int)uVar9 + 1) * (int)uVar13;
        uVar4 = (int)uVar9 * (int)uVar13;
        local_68 = (double)CONCAT44(local_68._4_4_,1);
        dVar19 = 0.0;
        RVar11 = (REF_DBL)(uVar13 & 0xffffffff);
        uVar15 = local_78;
        local_40 = uVar4;
        do {
          iVar17 = SUB84(RVar11,0);
          iVar12 = SUB84(dVar19,0);
          if (1 < (int)uVar9) {
            iVar14 = 1;
            local_d0 = (double)(ulong)uVar4;
            local_98 = (REF_DBL)(ulong)uVar2;
            local_58 = (double)CONCAT44(local_58._4_4_,uVar2);
            local_48 = CONCAT44(local_48._4_4_,uVar4);
            local_50 = CONCAT44(local_50._4_4_,SUB84(RVar11,0));
            local_c0 = RVar11;
            local_9c = SUB84(dVar19,0);
            local_88 = dVar19;
            do {
              local_60 = (double)CONCAT44(local_60._4_4_,iVar14);
              if (1 < (int)uVar13) {
                iVar17 = 0;
                do {
                  local_b8 = SUB84(local_88,0) + iVar17;
                  iVar14 = SUB84(local_88,0) + iVar17 + 1;
                  iVar12 = SUB84(local_c0,0) + iVar17;
                  iVar18 = SUB84(local_d0,0) + iVar17;
                  local_b4 = iVar14;
                  local_b0 = iVar12;
                  local_ac = iVar18;
                  uVar2 = ref_cell_add(local_c8->cell[8],&local_b8,&local_ec);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x683,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
                    return uVar2;
                  }
                  iVar8 = SUB84(local_d0,0) + iVar17 + 1;
                  local_b8 = iVar14;
                  local_b4 = iVar12;
                  local_b0 = iVar18;
                  local_ac = iVar8;
                  uVar2 = ref_cell_add(local_c8->cell[8],&local_b8,&local_ec);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x688,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
                    return uVar2;
                  }
                  local_ac = SUB84(local_98,0) + iVar17;
                  local_d8 = (double)CONCAT44(local_d8._4_4_,local_ac);
                  local_b8 = iVar12;
                  local_b4 = iVar18;
                  local_b0 = iVar8;
                  uVar2 = ref_cell_add(local_c8->cell[8],&local_b8,&local_ec);
                  pRVar16 = local_c8;
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x68d,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
                    return uVar2;
                  }
                  iVar18 = SUB84(local_c0,0) + iVar17 + 1;
                  local_b8 = iVar14;
                  local_b4 = iVar18;
                  local_b0 = iVar12;
                  local_ac = iVar8;
                  uVar2 = ref_cell_add(local_c8->cell[8],&local_b8,&local_ec);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x692,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
                    return uVar2;
                  }
                  local_ac = local_d8._0_4_;
                  local_b8 = iVar18;
                  local_b4 = iVar12;
                  local_b0 = iVar8;
                  uVar2 = ref_cell_add(pRVar16->cell[8],&local_b8,&local_ec);
                  uVar13 = local_a8;
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x697,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
                    return uVar2;
                  }
                  local_ac = SUB84(local_98,0) + iVar17 + 1;
                  local_b4 = local_d8._0_4_;
                  local_b8 = iVar18;
                  local_b0 = iVar8;
                  uVar2 = ref_cell_add(pRVar16->cell[8],&local_b8,&local_ec);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x69c,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"tet");
                    return uVar2;
                  }
                  iVar17 = iVar17 + 1;
                  uVar9 = local_90;
                  uVar15 = local_78;
                } while (local_7c != iVar17);
              }
              iVar14 = local_60._0_4_ + 1;
              iVar17 = (int)uVar13;
              local_98 = (REF_DBL)(ulong)(uint)(SUB84(local_98,0) + iVar17);
              local_c0 = (REF_DBL)(ulong)(uint)(SUB84(local_c0,0) + iVar17);
              local_d0 = (double)(ulong)(uint)(SUB84(local_d0,0) + iVar17);
              local_88 = (double)(ulong)(uint)(SUB84(local_88,0) + iVar17);
              uVar2 = local_58._0_4_;
              uVar4 = (uint)local_48;
              iVar17 = (int)local_50;
              iVar12 = local_9c;
            } while (iVar14 != (int)uVar9);
          }
          iVar14 = local_68._0_4_ + 1;
          uVar2 = uVar2 + local_40;
          RVar11 = (REF_DBL)(ulong)(iVar17 + local_40);
          uVar4 = uVar4 + local_40;
          dVar19 = (double)(ulong)(iVar12 + local_40);
          local_68 = (double)CONCAT44(local_68._4_4_,iVar14);
          iVar17 = (int)uVar15;
        } while (iVar14 != iVar17);
      }
      iVar12 = (int)uVar9;
      local_dc = 1;
      if (1 < iVar17) {
        iVar8 = iVar12 * (int)local_a8;
        local_d8 = (double)CONCAT44(local_d8._4_4_,(iVar12 + 1) * (int)local_a8);
        iVar18 = 1;
        iVar14 = 0;
        do {
          local_d0 = (double)CONCAT44(local_d0._4_4_,iVar18);
          local_c0 = (REF_DBL)CONCAT44(local_c0._4_4_,iVar14);
          iVar17 = local_a0;
          if (1 < (int)uVar9) {
            do {
              iVar12 = (int)local_a8 + iVar14;
              uVar4 = iVar8 + iVar14;
              local_e8 = iVar14;
              local_e4 = iVar12;
              local_e0 = uVar4;
              uVar2 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6ac,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
                return uVar2;
              }
              local_e4 = iVar14 + local_d8._0_4_;
              local_e8 = iVar12;
              local_e0 = uVar4;
              uVar2 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6b0,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
                return uVar2;
              }
              iVar17 = iVar17 + -1;
              iVar14 = iVar12;
            } while (iVar17 != 0);
          }
          iVar18 = local_d0._0_4_ + 1;
          iVar14 = local_c0._0_4_ + iVar8;
          iVar17 = (int)local_78;
          iVar12 = (int)local_90;
          uVar9 = local_90;
        } while (iVar18 != iVar17);
      }
      local_dc = 2;
      if (1 < iVar17) {
        iVar17 = (int)local_a8;
        uVar2 = (iVar12 + 2) * iVar17 - 1;
        local_88 = (double)CONCAT44(local_88._4_4_,iVar12 * iVar17);
        iVar18 = iVar17 * 2 + -1;
        uVar4 = (iVar12 + 1) * iVar17 - 1;
        iVar14 = 1;
        iVar12 = local_7c;
        do {
          local_98 = (REF_DBL)CONCAT44(local_98._4_4_,iVar14);
          local_c0 = (REF_DBL)CONCAT44(local_c0._4_4_,uVar4);
          local_d0 = (double)CONCAT44(local_d0._4_4_,iVar18);
          local_d8 = (double)CONCAT44(local_d8._4_4_,uVar2);
          iVar17 = local_a0;
          local_7c = iVar12;
          if (1 < (int)local_90) {
            do {
              local_e8 = iVar18;
              local_e4 = iVar12;
              local_e0 = uVar4;
              uVar3 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6c0,"ref_fixture_tet_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              local_e8 = iVar18;
              local_e4 = uVar4;
              local_e0 = uVar2;
              uVar3 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6c4,"ref_fixture_tet_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              iVar14 = (int)local_a8;
              uVar2 = uVar2 + iVar14;
              iVar18 = iVar18 + iVar14;
              uVar4 = uVar4 + iVar14;
              iVar12 = iVar12 + iVar14;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          iVar14 = local_98._0_4_ + 1;
          uVar2 = local_d8._0_4_ + local_88._0_4_;
          iVar18 = local_d0._0_4_ + local_88._0_4_;
          uVar4 = local_c0._0_4_ + local_88._0_4_;
          iVar12 = local_7c + local_88._0_4_;
          iVar17 = (int)local_78;
        } while (iVar14 != iVar17);
      }
      local_dc = 3;
      if (1 < iVar17) {
        uVar2 = (int)local_90 * (int)local_a8;
        iVar12 = (int)local_a8 + -1;
        iVar17 = 1;
        local_c0 = (REF_DBL)CONCAT44(local_c0._4_4_,uVar2);
        iVar14 = 1;
        local_98 = (REF_DBL)CONCAT44(local_98._4_4_,iVar12);
        do {
          local_d0 = (double)CONCAT44(local_d0._4_4_,iVar14);
          local_d8 = (double)CONCAT44(local_d8._4_4_,iVar17);
          uVar4 = uVar2;
          if (1 < (int)local_a8) {
            do {
              local_e4 = iVar17 + -1;
              local_e8 = iVar17;
              local_e0 = uVar4;
              uVar3 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6d4,"ref_fixture_tet_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              local_e8 = iVar17;
              local_e4 = uVar4;
              local_e0 = uVar4 + 1;
              uVar3 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6d8,"ref_fixture_tet_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              iVar17 = iVar17 + 1;
              iVar12 = iVar12 + -1;
              uVar4 = uVar4 + 1;
            } while (iVar12 != 0);
          }
          iVar14 = local_d0._0_4_ + 1;
          uVar2 = uVar2 + local_c0._0_4_;
          iVar17 = local_d8._0_4_ + local_c0._0_4_;
          iVar12 = local_98._0_4_;
        } while (iVar14 != (int)local_78);
      }
      local_dc = 4;
      pRVar16 = local_c8;
      if (1 < (int)local_78) {
        iVar12 = (int)local_a8;
        iVar17 = local_a0 * iVar12;
        uVar2 = ((int)local_90 * 2 + -1) * iVar12;
        local_c0 = (REF_DBL)CONCAT44(local_c0._4_4_,(int)local_90 * iVar12);
        local_d8 = (double)CONCAT44(local_d8._4_4_,1);
        local_d0 = (double)CONCAT44(local_d0._4_4_,iVar12 + -1);
        iVar12 = iVar12 + -1;
        do {
          uVar4 = uVar2;
          local_a0 = iVar17;
          if (1 < (int)local_a8) {
            do {
              iVar14 = iVar17 + 1;
              local_e8 = iVar17;
              local_e4 = iVar14;
              local_e0 = uVar4;
              uVar3 = ref_cell_add(pRVar16->cell[3],&local_e8,&local_ec);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6e8,"ref_fixture_tet_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              local_e8 = iVar14;
              local_e4 = uVar4 + 1;
              local_e0 = uVar4;
              uVar3 = ref_cell_add(pRVar16->cell[3],&local_e8,&local_ec);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6ec,"ref_fixture_tet_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              iVar12 = iVar12 + -1;
              pRVar16 = local_c8;
              iVar17 = iVar14;
              uVar4 = uVar4 + 1;
            } while (iVar12 != 0);
          }
          iVar14 = local_d8._0_4_ + 1;
          uVar2 = uVar2 + local_c0._0_4_;
          iVar17 = local_a0 + local_c0._0_4_;
          local_d8 = (double)CONCAT44(local_d8._4_4_,iVar14);
          iVar12 = local_d0._0_4_;
        } while (iVar14 != (int)local_78);
      }
      local_dc = 5;
      iVar17 = (int)local_90;
      if (1 < iVar17) {
        local_c0 = (REF_DBL)CONCAT44(local_c0._4_4_,(int)local_a8 + -1);
        iVar12 = 1;
        uVar13 = local_a8 & 0xffffffff;
        local_d8 = (double)CONCAT44(local_d8._4_4_,1);
        do {
          local_d0 = (double)CONCAT44(local_d0._4_4_,iVar12);
          iVar14 = (int)uVar13;
          iVar17 = local_c0._0_4_;
          if (1 < (int)local_a8) {
            do {
              local_e8 = iVar12 + -1;
              uVar4 = (uint)uVar13;
              local_e4 = iVar12;
              local_e0 = uVar4;
              uVar2 = ref_cell_add(pRVar16->cell[3],&local_e8,&local_ec);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x6fc,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
                return uVar2;
              }
              local_e8 = iVar12;
              local_e4 = uVar4 + 1;
              local_e0 = uVar4;
              uVar2 = ref_cell_add(pRVar16->cell[3],&local_e8,&local_ec);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x700,"ref_fixture_tet_brick_args_grid",(ulong)uVar2,"qua");
                return uVar2;
              }
              iVar12 = iVar12 + 1;
              uVar13 = (ulong)(uVar4 + 1);
              iVar17 = iVar17 + -1;
              pRVar16 = local_c8;
            } while (iVar17 != 0);
          }
          iVar18 = local_d8._0_4_ + 1;
          uVar13 = (ulong)(uint)(iVar14 + (int)local_a8);
          iVar12 = local_d0._0_4_ + (int)local_a8;
          local_d8 = (double)CONCAT44(local_d8._4_4_,iVar18);
          iVar17 = (int)local_90;
        } while (iVar18 != iVar17);
      }
      iVar12 = (int)local_a8;
      local_dc = 6;
      if (1 < iVar17) {
        iVar14 = local_6c * iVar17 * iVar12;
        local_d0 = (double)CONCAT44(local_d0._4_4_,iVar12 + -1);
        uVar2 = (local_6c * iVar17 + 1) * iVar12;
        local_d8 = (double)CONCAT44(local_d8._4_4_,1);
        do {
          iVar12 = local_d0._0_4_;
          iVar17 = iVar14;
          local_6c = uVar2;
          if (1 < (int)local_a8) {
            do {
              iVar18 = iVar17 + 1;
              local_e8 = iVar18;
              local_e4 = iVar17;
              local_e0 = uVar2;
              uVar4 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x710,"ref_fixture_tet_brick_args_grid",(ulong)uVar4,"qua");
                return uVar4;
              }
              local_e8 = iVar18;
              local_e4 = uVar2;
              local_e0 = uVar2 + 1;
              uVar4 = ref_cell_add(local_c8->cell[3],&local_e8,&local_ec);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x714,"ref_fixture_tet_brick_args_grid",(ulong)uVar4,"qua");
                return uVar4;
              }
              iVar12 = iVar12 + -1;
              uVar2 = uVar2 + 1;
              iVar17 = iVar18;
            } while (iVar12 != 0);
          }
          iVar18 = local_d8._0_4_ + 1;
          iVar12 = (int)local_a8;
          uVar2 = local_6c + iVar12;
          iVar14 = iVar14 + iVar12;
          iVar17 = (int)local_90;
          local_d8 = (double)CONCAT44(local_d8._4_4_,iVar18);
        } while (iVar18 != iVar17);
      }
      uVar2 = ref_node_initialize_n_global(local_38,(long)(iVar17 * iVar12 * (int)local_78));
      if (uVar2 == 0) {
        return 0;
      }
      uVar15 = (ulong)uVar2;
      pcVar10 = "init glob";
      uVar6 = 0x717;
    }
    else {
      uVar2 = ref_node_initialize_n_global(ref_node,(long)(m * l * n));
      if (uVar2 == 0) {
        return 0;
      }
      uVar15 = (ulong)uVar2;
      pcVar10 = "init glob";
      uVar6 = 0x661;
    }
  }
  else {
    pcVar10 = "create";
    uVar6 = 0x65c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6,
         "ref_fixture_tet_brick_args_grid",uVar15,pcVar10);
  return (REF_STATUS)uVar15;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], tet[4], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        tet[0] = hex[0];
        tet[1] = hex[1];
        tet[2] = hex[3];
        tet[3] = hex[4];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[3];
        tet[2] = hex[4];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[3];
        tet[1] = hex[4];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[1];
        tet[1] = hex[2];
        tet[2] = hex[3];
        tet[3] = hex[5];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[3];
        tet[2] = hex[5];
        tet[3] = hex[7];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
        tet[0] = hex[2];
        tet[1] = hex[7];
        tet[2] = hex[5];
        tet[3] = hex[6];
        RSS(ref_cell_add(ref_grid_tet(ref_grid), tet, &cell), "tet");
      }

  quad[4] = 1;
  tri[3] = quad[4];
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 2;
  tri[3] = quad[4];
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 3;
  tri[3] = quad[4];
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 4;
  tri[3] = quad[4];
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}